

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::PrintOnOneLine(char *str,int max_length)

{
  long lVar1;
  long in_FS_OFFSET;
  int local_20;
  int i;
  int max_length_local;
  char *str_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (str != (char *)0x0) {
    local_20 = 0;
    for (_i = str; *_i != '\0'; _i = _i + 1) {
      if (max_length <= local_20) {
        printf("...");
        break;
      }
      if (*_i == '\n') {
        printf("\\n");
        local_20 = local_20 + 2;
      }
      else {
        printf("%c",(ulong)(uint)(int)*_i);
        local_20 = local_20 + 1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void PrintOnOneLine(const char* str, int max_length) {
  if (str != NULL) {
    for (int i = 0; *str != '\0'; ++str) {
      if (i >= max_length) {
        printf("...");
        break;
      }
      if (*str == '\n') {
        printf("\\n");
        i += 2;
      } else {
        printf("%c", *str);
        ++i;
      }
    }
  }
}